

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

void vkt::texture::util::calcUnnormalizedCoordRange
               (Vec4 *coord,IVec3 *levelSize,FloatFormat *internalFormat,Vec3 *unnormalizedCoordMin,
               Vec3 *unnormalizedCoordMax)

{
  bool bVar1;
  double dVar2;
  int compNdx;
  long lVar3;
  Interval unnormalizedCoordInterval;
  Interval coordInterval;
  Interval local_a8;
  Interval local_88;
  IVec3 *local_68;
  Vec3 *local_60;
  Vec3 *local_58;
  double local_50;
  Interval local_48;
  
  local_68 = levelSize;
  local_60 = unnormalizedCoordMin;
  local_58 = unnormalizedCoordMax;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    local_50 = (double)local_68->m_data[lVar3];
    dVar2 = (double)coord->m_data[lVar3];
    bVar1 = NAN(coord->m_data[lVar3]);
    local_88.m_hasNaN = bVar1;
    local_88.m_lo = INFINITY;
    if (!bVar1) {
      local_88.m_lo = dVar2;
    }
    local_88.m_hi = -INFINITY;
    if (!bVar1) {
      local_88.m_hi = dVar2;
    }
    tcu::FloatFormat::roundOut(&local_a8,internalFormat,&local_88,false);
    local_88.m_hi = local_a8.m_hi;
    local_88.m_hasNaN = local_a8.m_hasNaN;
    local_88._1_7_ = local_a8._1_7_;
    local_88.m_lo = local_a8.m_lo;
    local_48.m_hasNaN = false;
    local_48.m_lo = local_50;
    local_48.m_hi = local_50;
    tcu::operator*(&local_a8,&local_88,&local_48);
    tcu::FloatFormat::roundOut(&local_48,internalFormat,&local_a8,false);
    local_a8.m_hi = local_48.m_hi;
    local_a8._1_7_ = local_48._1_7_;
    local_a8.m_hasNaN = local_48.m_hasNaN;
    local_a8.m_lo = local_48.m_lo;
    local_60->m_data[lVar3] = (float)local_48.m_lo;
    local_58->m_data[lVar3] = (float)local_48.m_hi;
  }
  return;
}

Assistant:

void calcUnnormalizedCoordRange (const Vec4&		coord,
								 const IVec3&		levelSize,
								 const FloatFormat& internalFormat,
								 Vec3&				unnormalizedCoordMin,
								 Vec3&				unnormalizedCoordMax)
{
    for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const int size = levelSize[compNdx];

		Interval coordInterval = Interval(coord[compNdx]);
		coordInterval = internalFormat.roundOut(coordInterval, false);

		Interval unnormalizedCoordInterval = coordInterval * Interval((double) size);
		unnormalizedCoordInterval = internalFormat.roundOut(unnormalizedCoordInterval, false);

		unnormalizedCoordMin[compNdx] = (float)unnormalizedCoordInterval.lo();
		unnormalizedCoordMax[compNdx] = (float)unnormalizedCoordInterval.hi();
	}
}